

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * mjs::get_this_arg(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                         value *this_arg)

{
  value_type vVar1;
  global_object *pgVar2;
  object_ptr local_50 [2];
  gc_heap_ptr<mjs::object> local_30;
  value *local_20;
  value *this_arg_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  local_20 = this_arg;
  this_arg_local = (value *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)__return_storage_ptr__;
  vVar1 = value::type(this_arg);
  if ((vVar1 != undefined) && (vVar1 = value::type(local_20), vVar1 != null)) {
    pgVar2 = gc_heap_ptr<mjs::global_object>::operator->
                       ((gc_heap_ptr<mjs::global_object> *)this_arg_local);
    (*(pgVar2->super_object)._vptr_object[0x11])(local_50,pgVar2,local_20);
    value::value(__return_storage_ptr__,local_50);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(local_50);
    return __return_storage_ptr__;
  }
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::global_object,void>
            (&local_30,(gc_heap_ptr<mjs::global_object> *)this_arg_local);
  value::value(__return_storage_ptr__,&local_30);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_30);
  return __return_storage_ptr__;
}

Assistant:

value get_this_arg(const gc_heap_ptr<global_object>& global, const value& this_arg) {
    if (this_arg.type() == value_type::undefined || this_arg.type() == value_type::null) {
        return value{global};
    } else {
        return value{global->to_object(this_arg)};
    }
}